

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

Test * __thiscall
testing::internal::
ParameterizedTestFactory<simd_test_avx2::V256_V256_Part3_avx2_TestIntrinsics_Test>::CreateTest
          (ParameterizedTestFactory<simd_test_avx2::V256_V256_Part3_avx2_TestIntrinsics_Test> *this)

{
  Test *this_00;
  
  WithParamInterface<std::tuple<unsigned_int,unsigned_int,char_const*>>::parameter_ =
       &this->parameter_;
  this_00 = (Test *)operator_new(0x28);
  Test::Test(this_00);
  this_00->_vptr_Test = (_func_int **)&PTR__TestWithParam_01067dc8;
  this_00[1]._vptr_Test = (_func_int **)&PTR__V256_V256_Part3_avx2_TestIntrinsics_Test_01067e08;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }